

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec3.cpp
# Opt level: O0

bool refract(Vec3 *vector,Vec3 *normal,float ni_over_nt,Vec3 *refracted)

{
  float *in_RDX;
  Vec3 *in_RSI;
  float in_XMM0_Da;
  undefined4 uVar1;
  double dVar2;
  float _discriminant;
  float _dt;
  Vec3 _uv;
  Vec3 *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  Vec3 local_88 [2];
  Vec3 local_6c;
  Vec3 local_60;
  Vec3 local_54;
  Vec3 local_48;
  float local_3c;
  float local_38;
  Vec3 local_34;
  float *local_28;
  float local_1c;
  Vec3 *local_18;
  byte local_1;
  
  local_28 = in_RDX;
  local_1c = in_XMM0_Da;
  local_18 = in_RSI;
  unit_vector((Vec3 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_38 = dot(&local_34,local_18);
  local_3c = -(local_1c * local_1c) * (-local_38 * local_38 + 1.0) + 1.0;
  local_1 = 0.0 < local_3c;
  if ((bool)local_1) {
    operator*((Vec3 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
              (float)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    operator-((Vec3 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
              in_stack_ffffffffffffff60);
    operator*(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
    dVar2 = std::sqrt((double)(ulong)(uint)local_3c);
    uVar1 = SUB84(dVar2,0);
    operator*((Vec3 *)CONCAT44(uVar1,in_stack_ffffffffffffff68),(float)((ulong)local_18 >> 0x20));
    operator-((Vec3 *)CONCAT44(uVar1,in_stack_ffffffffffffff68),local_18);
    *(undefined8 *)local_28 = local_48.e._0_8_;
    local_28[2] = local_48.e[2];
    Vec3::~Vec3(&local_48);
    Vec3::~Vec3(local_88);
    Vec3::~Vec3(&local_54);
    Vec3::~Vec3(&local_60);
    Vec3::~Vec3(&local_6c);
  }
  Vec3::~Vec3(&local_34);
  return (bool)(local_1 & 1);
}

Assistant:

bool
refract(const Vec3& vector, const Vec3& normal, float ni_over_nt, Vec3& refracted)
{
    Vec3  _uv           = unit_vector(vector);
    float _dt           = dot(_uv, normal);
    float _discriminant = 1.0f - ni_over_nt*ni_over_nt*(1.0f-_dt*_dt);

    if (_discriminant > 0.0f) {
        refracted = ni_over_nt*(_uv - normal*_dt) - normal*sqrt(_discriminant);
        return true;
    }
    return false;
}